

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

void __thiscall
glcts::TextureParameters::TextureParameters
          (TextureParameters *this,GLuint textureBufferSize,GLenum textureFormat,
          GLenum textureUniforType,char *uniformName)

{
  (this->m_uniform_name)._M_dataplus._M_p = (pointer)&(this->m_uniform_name).field_2;
  (this->m_uniform_name)._M_string_length = 0;
  (this->m_uniform_name).field_2._M_local_buf[0] = '\0';
  this->m_texture_buffer_size = textureBufferSize;
  this->m_texture_format = textureFormat;
  this->m_texture_uniform_type = textureUniforType;
  strlen(uniformName);
  std::__cxx11::string::_M_replace((ulong)&this->m_uniform_name,0,(char *)0x0,(ulong)uniformName);
  return;
}

Assistant:

TextureParameters::TextureParameters(glw::GLuint textureBufferSize, glw::GLenum textureFormat,
									 glw::GLenum textureUniforType, const char* uniformName)
{
	m_texture_buffer_size  = textureBufferSize;
	m_texture_format	   = textureFormat;
	m_texture_uniform_type = textureUniforType;
	m_uniform_name		   = uniformName;
}